

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnSimdLaneOpExpr
          (ExprVisitorDelegate *this,SimdLaneOpExpr *expr)

{
  WatWriter *pWVar1;
  Info local_68;
  
  pWVar1 = this->writer_;
  Opcode::GetInfo(&local_68,&expr->opcode);
  WritePuts(pWVar1,local_68.name,Space);
  Writef(this->writer_,"%lu",expr->val);
  pWVar1 = this->writer_;
  if (pWVar1->next_char_ == ForceNewline) {
    WriteNextChar(pWVar1);
  }
  pWVar1->next_char_ = Newline;
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnSimdLaneOpExpr(SimdLaneOpExpr* expr) {
  writer_->WritePutsSpace(expr->opcode.GetName());
  writer_->Writef("%" PRIu64, (expr->val));
  writer_->WriteNewline(NO_FORCE_NEWLINE);
  return Result::Ok;
}